

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_call(HighsInt num_col,HighsInt num_row,HighsInt num_nz,double *col_cost,
                   double *col_lower,double *col_upper,double *row_lower,double *row_upper,
                   HighsInt *a_start,HighsInt *a_index,double *a_value,double *col_value,
                   double *col_dual,double *row_value,double *row_dual,HighsInt *col_basis_status,
                   HighsInt *row_basis_status,HighsInt *model_status)

{
  HighsInt HVar1;
  double offset;
  HighsInt sense;
  HighsInt aformat_columnwise;
  double *in_stack_000051a8;
  double in_stack_000051b0;
  HighsInt in_stack_000051b8;
  HighsInt in_stack_000051bc;
  HighsInt in_stack_000051c0;
  HighsInt in_stack_000051c4;
  HighsInt in_stack_000051c8;
  double *in_stack_00005200;
  double *in_stack_00005208;
  double *in_stack_00005210;
  double *in_stack_00005218;
  HighsInt *in_stack_00005220;
  HighsInt *in_stack_00005228;
  double *in_stack_00005230;
  double *in_stack_00005238;
  double *in_stack_00005240;
  double *in_stack_00005248;
  double *in_stack_00005250;
  HighsInt *in_stack_00005258;
  HighsInt *in_stack_00005260;
  HighsInt *in_stack_00005268;
  
  printf("Method Highs_call is deprecated: alternative method is Highs_lpCall\n");
  HVar1 = Highs_lpCall(in_stack_000051c8,in_stack_000051c4,in_stack_000051c0,in_stack_000051bc,
                       in_stack_000051b8,in_stack_000051b0,in_stack_000051a8,in_stack_00005200,
                       in_stack_00005208,in_stack_00005210,in_stack_00005218,in_stack_00005220,
                       in_stack_00005228,in_stack_00005230,in_stack_00005238,in_stack_00005240,
                       in_stack_00005248,in_stack_00005250,in_stack_00005258,in_stack_00005260,
                       in_stack_00005268);
  return HVar1;
}

Assistant:

HighsInt Highs_call(const HighsInt num_col, const HighsInt num_row,
                    const HighsInt num_nz, const double* col_cost,
                    const double* col_lower, const double* col_upper,
                    const double* row_lower, const double* row_upper,
                    const HighsInt* a_start, const HighsInt* a_index,
                    const double* a_value, double* col_value, double* col_dual,
                    double* row_value, double* row_dual,
                    HighsInt* col_basis_status, HighsInt* row_basis_status,
                    HighsInt* model_status) {
  printf(
      "Method Highs_call is deprecated: alternative method is Highs_lpCall\n");
  const HighsInt aformat_columnwise = 1;
  const HighsInt sense = 1;
  const double offset = 0;
  return Highs_lpCall(num_col, num_row, num_nz, aformat_columnwise, sense,
                      offset, col_cost, col_lower, col_upper, row_lower,
                      row_upper, a_start, a_index, a_value, col_value, col_dual,
                      row_value, row_dual, col_basis_status, row_basis_status,
                      model_status);
}